

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::StyledWriter::isMultineArray(StyledWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  int index;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  AVar2 = Value::size(value);
  bVar9 = this->rightMargin_ <= (int)(AVar2 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  iVar5 = 0;
  while ((iVar5 < (int)AVar2 && (!bVar9))) {
    pVVar4 = Value::operator[](value,iVar5);
    if ((*(ushort *)&pVVar4->field_0x8 & 0xfe) == 6) {
      AVar3 = Value::size(pVVar4);
      bVar9 = AVar3 != 0;
    }
    else {
      bVar9 = false;
    }
    iVar5 = iVar5 + 1;
  }
  bVar1 = true;
  if (!bVar9) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(long)(int)AVar2);
    this->addChildValues_ = true;
    iVar5 = AVar2 * 2 + 2;
    uVar6 = 0;
    uVar8 = (ulong)AVar2;
    if ((int)AVar2 < 1) {
      uVar8 = uVar6;
    }
    lVar7 = 8;
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      pVVar4 = Value::operator[](value,(int)uVar6);
      writeValue(this,pVVar4);
      iVar5 = iVar5 + *(int *)((long)&(((this->childValues_).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar7);
      lVar7 = lVar7 + 0x20;
    }
    this->addChildValues_ = false;
    bVar1 = this->rightMargin_ <= iVar5;
  }
  return bVar1;
}

Assistant:

bool StyledWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}